

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::ShowMetricsWindow::Funcs::NodeWindow(ImGuiWindow *window,char *label)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  uint uVar5;
  ImGuiColumnsSet *pIVar6;
  bool bVar7;
  undefined4 extraout_EAX;
  char *pcVar8;
  char *label_00;
  char *pcVar9;
  long lVar10;
  ulong uVar11;
  char *pcVar12;
  char *pcVar13;
  char *pcVar14;
  char *pcVar15;
  char *pcVar16;
  char *pcVar17;
  long lVar18;
  char *pcVar19;
  int iVar20;
  int iVar21;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar22 [16];
  
  uVar11 = 1;
  if (window->Active == false) {
    uVar11 = (ulong)window->WasActive;
  }
  bVar7 = TreeNode(window,"%s \'%s\', %d @ 0x%p",label,window->Name,uVar11,window);
  if (!bVar7) {
    return;
  }
  uVar5 = window->Flags;
  NodeDrawList(window,window->DrawList,label_00);
  BulletText("Pos: (%.1f,%.1f), Size: (%.1f,%.1f), SizeContents (%.1f,%.1f)",(double)(window->Pos).x
             ,(double)(window->Pos).y,(double)(window->Size).x,(double)(window->Size).y,
             (double)(window->SizeContents).x,(double)(window->SizeContents).y);
  pcVar9 = "Child ";
  if ((uVar5 >> 0x18 & 1) == 0) {
    pcVar9 = "";
  }
  auVar25._0_4_ = -(uint)((uVar5 & 0x10000000) == 0);
  auVar25._4_4_ = -(uint)((uVar5 & 0x8000000) == 0);
  auVar25._8_4_ = -(uint)((uVar5 & 0x4000000) == 0);
  auVar25._12_4_ = -(uint)((uVar5 & 0x2000000) == 0);
  auVar24._0_4_ = -(uint)((uVar5 & 0x40) == 0);
  auVar24._4_4_ = -(uint)((uVar5 & 0x40000) == 0);
  auVar24._8_4_ = -(uint)((uVar5 & 0x200) == 0);
  auVar24._12_4_ = -(uint)((uVar5 & 0x100) == 0);
  auVar25 = packssdw(auVar24,auVar25);
  auVar25 = packsswb(auVar25,auVar25);
  pcVar8 = "Tooltip ";
  if ((auVar25 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    pcVar8 = "";
  }
  pcVar12 = "Popup ";
  if ((auVar25 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    pcVar12 = "";
  }
  pcVar13 = "Modal ";
  if ((auVar25 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    pcVar13 = "";
  }
  pcVar14 = "ChildMenu ";
  if ((auVar25 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    pcVar14 = "";
  }
  pcVar15 = "NoSavedSettings ";
  if ((auVar25 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    pcVar15 = "";
  }
  pcVar17 = "NoMouseInputs";
  if ((auVar25 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    pcVar17 = "";
  }
  pcVar19 = "NoNavInputs";
  if ((auVar25 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    pcVar19 = "";
  }
  pcVar16 = "AlwaysAutoResize";
  if ((auVar25 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    pcVar16 = "";
  }
  BulletText("Flags: 0x%08X (%s%s%s%s%s%s%s%s%s..)",(ulong)uVar5,pcVar9,pcVar8,pcVar12,pcVar13,
             pcVar14,pcVar15,pcVar17,pcVar19,pcVar16);
  iVar20 = -(uint)((window->SizeContents).x - ((window->SizeFull).x - (window->ScrollbarSizes).x) <=
                  0.0);
  iVar21 = -(uint)((window->SizeContents).y - ((window->SizeFull).y - (window->ScrollbarSizes).y) <=
                  0.0);
  auVar23._4_4_ = iVar21;
  auVar23._0_4_ = iVar20;
  auVar23._8_4_ = iVar21;
  auVar23._12_4_ = iVar21;
  auVar22._8_8_ = auVar23._8_8_;
  auVar22._4_4_ = iVar20;
  auVar22._0_4_ = iVar20;
  movmskpd(extraout_EAX,auVar22);
  BulletText("Scroll: (%.2f/%.2f,%.2f/%.2f)",(double)(window->Scroll).x);
  if ((window->Active != false) || (uVar11 = 0xffffffff, window->WasActive != false)) {
    uVar11 = (ulong)(uint)(int)window->BeginOrderWithinContext;
  }
  BulletText("Active: %d/%d, WriteAccessed: %d, BeginOrderWithinContext: %d",(ulong)window->Active,
             (ulong)window->WasActive,(ulong)window->WriteAccessed,uVar11);
  BulletText("Appearing: %d, Hidden: %d (Reg %d Resize %d), SkipItems: %d",(ulong)window->Appearing,
             (ulong)window->Hidden,(ulong)(uint)window->HiddenFramesRegular,
             (ulong)(uint)window->HiddenFramesForResize,(ulong)window->SkipItems);
  BulletText("NavLastIds: 0x%08X,0x%08X, NavLayerActiveMask: %X",(ulong)window->NavLastIds[0],
             (ulong)window->NavLastIds[1],(ulong)(uint)(window->DC).NavLayerActiveMask);
  if (window->NavLastChildNavWindow == (ImGuiWindow *)0x0) {
    pcVar9 = "NULL";
  }
  else {
    pcVar9 = window->NavLastChildNavWindow->Name;
  }
  BulletText("NavLastChildNavWindow: %s",pcVar9);
  fVar1 = window->NavRectRel[0].Min.x;
  fVar2 = window->NavRectRel[0].Max.x;
  if (fVar1 <= fVar2) {
    fVar3 = window->NavRectRel[0].Min.y;
    fVar4 = window->NavRectRel[0].Max.y;
    if (fVar3 <= fVar4) {
      BulletText("NavRectRel[0]: (%.1f,%.1f)(%.1f,%.1f)",(double)fVar1,(double)fVar3,(double)fVar2,
                 (double)fVar4);
      goto LAB_0012f32d;
    }
  }
  BulletText("NavRectRel[0]: <None>");
LAB_0012f32d:
  if (window->RootWindow != window) {
    NodeWindow(window->RootWindow,"RootWindow");
  }
  if (window->ParentWindow != (ImGuiWindow *)0x0) {
    NodeWindow(window->ParentWindow,"ParentWindow");
  }
  if (0 < (window->DC).ChildWindows.Size) {
    NodeWindows(&(window->DC).ChildWindows,"ChildWindows");
  }
  if ((0 < (window->ColumnsStorage).Size) &&
     (bVar7 = TreeNode("Columns","Columns sets (%d)"), bVar7)) {
    if (0 < (window->ColumnsStorage).Size) {
      lVar10 = 0;
      do {
        pIVar6 = (window->ColumnsStorage).Data;
        bVar7 = TreeNode((void *)(ulong)pIVar6[lVar10].ID,
                         "Columns Id: 0x%08X, Count: %d, Flags: 0x%04X",
                         (void *)(ulong)pIVar6[lVar10].ID,(ulong)(uint)pIVar6[lVar10].Count,
                         (ulong)(uint)pIVar6[lVar10].Flags);
        if (bVar7) {
          BulletText("Width: %.1f (MinX: %.1f, MaxX: %.1f)",
                     (double)(pIVar6[lVar10].MaxX - pIVar6[lVar10].MinX),(double)pIVar6[lVar10].MinX
                     ,(double)pIVar6[lVar10].MaxX);
          if (0 < pIVar6[lVar10].Columns.Size) {
            lVar18 = 0;
            uVar11 = 0;
            do {
              fVar1 = *(float *)((long)&(pIVar6[lVar10].Columns.Data)->OffsetNorm + lVar18);
              BulletText("Column %02d: OffsetNorm %.3f (= %.1f px)",(double)fVar1,
                         (double)((pIVar6[lVar10].MaxX - pIVar6[lVar10].MinX) * fVar1),
                         uVar11 & 0xffffffff);
              uVar11 = uVar11 + 1;
              lVar18 = lVar18 + 0x1c;
            } while ((long)uVar11 < (long)pIVar6[lVar10].Columns.Size);
          }
          TreePop();
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 < (window->ColumnsStorage).Size);
    }
    TreePop();
  }
  BulletText("Storage: %d bytes",(ulong)(uint)((window->StateStorage).Data.Size << 4));
  TreePop();
  return;
}

Assistant:

static void NodeWindow(ImGuiWindow* window, const char* label)
        {
            if (!ImGui::TreeNode(window, "%s '%s', %d @ 0x%p", label, window->Name, window->Active || window->WasActive, window))
                return;
            ImGuiWindowFlags flags = window->Flags;
            NodeDrawList(window, window->DrawList, "DrawList");
            ImGui::BulletText("Pos: (%.1f,%.1f), Size: (%.1f,%.1f), SizeContents (%.1f,%.1f)", window->Pos.x, window->Pos.y, window->Size.x, window->Size.y, window->SizeContents.x, window->SizeContents.y);
            ImGui::BulletText("Flags: 0x%08X (%s%s%s%s%s%s%s%s%s..)", flags,
                (flags & ImGuiWindowFlags_ChildWindow)  ? "Child " : "",      (flags & ImGuiWindowFlags_Tooltip)     ? "Tooltip "   : "",  (flags & ImGuiWindowFlags_Popup) ? "Popup " : "",
                (flags & ImGuiWindowFlags_Modal)        ? "Modal " : "",      (flags & ImGuiWindowFlags_ChildMenu)   ? "ChildMenu " : "",  (flags & ImGuiWindowFlags_NoSavedSettings) ? "NoSavedSettings " : "",
                (flags & ImGuiWindowFlags_NoMouseInputs)? "NoMouseInputs":"", (flags & ImGuiWindowFlags_NoNavInputs) ? "NoNavInputs" : "", (flags & ImGuiWindowFlags_AlwaysAutoResize) ? "AlwaysAutoResize" : "");
            ImGui::BulletText("Scroll: (%.2f/%.2f,%.2f/%.2f)", window->Scroll.x, GetWindowScrollMaxX(window), window->Scroll.y, GetWindowScrollMaxY(window));
            ImGui::BulletText("Active: %d/%d, WriteAccessed: %d, BeginOrderWithinContext: %d", window->Active, window->WasActive, window->WriteAccessed, (window->Active || window->WasActive) ? window->BeginOrderWithinContext : -1);
            ImGui::BulletText("Appearing: %d, Hidden: %d (Reg %d Resize %d), SkipItems: %d", window->Appearing, window->Hidden, window->HiddenFramesRegular, window->HiddenFramesForResize, window->SkipItems);
            ImGui::BulletText("NavLastIds: 0x%08X,0x%08X, NavLayerActiveMask: %X", window->NavLastIds[0], window->NavLastIds[1], window->DC.NavLayerActiveMask);
            ImGui::BulletText("NavLastChildNavWindow: %s", window->NavLastChildNavWindow ? window->NavLastChildNavWindow->Name : "NULL");
            if (!window->NavRectRel[0].IsInverted())
                ImGui::BulletText("NavRectRel[0]: (%.1f,%.1f)(%.1f,%.1f)", window->NavRectRel[0].Min.x, window->NavRectRel[0].Min.y, window->NavRectRel[0].Max.x, window->NavRectRel[0].Max.y);
            else
                ImGui::BulletText("NavRectRel[0]: <None>");
            if (window->RootWindow != window) NodeWindow(window->RootWindow, "RootWindow");
            if (window->ParentWindow != NULL) NodeWindow(window->ParentWindow, "ParentWindow");
            if (window->DC.ChildWindows.Size > 0) NodeWindows(window->DC.ChildWindows, "ChildWindows");
            if (window->ColumnsStorage.Size > 0 && ImGui::TreeNode("Columns", "Columns sets (%d)", window->ColumnsStorage.Size))
            {
                for (int n = 0; n < window->ColumnsStorage.Size; n++)
                {
                    const ImGuiColumnsSet* columns = &window->ColumnsStorage[n];
                    if (ImGui::TreeNode((void*)(uintptr_t)columns->ID, "Columns Id: 0x%08X, Count: %d, Flags: 0x%04X", columns->ID, columns->Count, columns->Flags))
                    {
                        ImGui::BulletText("Width: %.1f (MinX: %.1f, MaxX: %.1f)", columns->MaxX - columns->MinX, columns->MinX, columns->MaxX);
                        for (int column_n = 0; column_n < columns->Columns.Size; column_n++)
                            ImGui::BulletText("Column %02d: OffsetNorm %.3f (= %.1f px)", column_n, columns->Columns[column_n].OffsetNorm, OffsetNormToPixels(columns, columns->Columns[column_n].OffsetNorm));
                        ImGui::TreePop();
                    }
                }
                ImGui::TreePop();
            }
            ImGui::BulletText("Storage: %d bytes", window->StateStorage.Data.Size * (int)sizeof(ImGuiStorage::Pair));
            ImGui::TreePop();
        }